

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

char * stbi_zlib_decode_malloc_guesssize_headerflag
                 (char *buffer,int len,int initial_size,int *outlen,int parse_header)

{
  int iVar1;
  void *pvVar2;
  int *in_RCX;
  int in_ESI;
  long in_RDI;
  char *p;
  stbi__zbuf a;
  stbi__zbuf *in_stack_ffffffffffffefe0;
  undefined4 local_1010;
  undefined8 local_1008;
  undefined8 local_8;
  
  pvVar2 = stbi__malloc(0x15fa8a);
  if (pvVar2 == (void *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = stbi__do_zlib(in_stack_ffffffffffffefe0,(char *)(in_RDI + in_ESI),
                          (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)pvVar2 >> 0x20));
    if (iVar1 == 0) {
      free(local_1008);
      local_8 = (char *)0x0;
    }
    else {
      if (in_RCX != (int *)0x0) {
        *in_RCX = local_1010 - (int)local_1008;
      }
      local_8 = local_1008;
    }
  }
  return local_8;
}

Assistant:

STBIDEF char *stbi_zlib_decode_malloc_guesssize_headerflag(const char *buffer, int len, int initial_size, int *outlen, int parse_header)
{
   stbi__zbuf a;
   char *p = (char *) stbi__malloc(initial_size);
   if (p == NULL) return NULL;
   a.zbuffer = (stbi_uc *) buffer;
   a.zbuffer_end = (stbi_uc *) buffer + len;
   if (stbi__do_zlib(&a, p, initial_size, 1, parse_header)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      STBI_FREE(a.zout_start);
      return NULL;
   }
}